

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CDirectiveFile.cpp
# Opt level: O0

void __thiscall CDirectiveFile::Encode(CDirectiveFile *this)

{
  int iVar1;
  FileManager *this_00;
  shared_ptr<AssemblerFile> local_20;
  CDirectiveFile *local_10;
  CDirectiveFile *this_local;
  
  this_00 = g_fileManager;
  iVar1 = *(int *)&(this->super_CAssemblerCommand).field_0x14;
  if (iVar1 != 0) {
    local_10 = this;
    if (iVar1 - 1U < 3) {
      std::shared_ptr<AssemblerFile>::shared_ptr<GenericAssemblerFile,void>(&local_20,&this->file);
      FileManager::openFile(this_00,&local_20,false);
      std::shared_ptr<AssemblerFile>::~shared_ptr(&local_20);
    }
    else if (iVar1 == 4) {
      FileManager::closeFile(g_fileManager);
    }
  }
  return;
}

Assistant:

void CDirectiveFile::Encode() const
{
	switch (type)
	{
	case Type::Open:
	case Type::Create:
	case Type::Copy:
		g_fileManager->openFile(file,false);
		break;
	case Type::Close:
		g_fileManager->closeFile();
		break;
	case Type::Invalid:
		// TODO: Assert?
		break;
	}
}